

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor_pointer.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  Creature goblin;
  IncreaseDefenseModifier rt2;
  CreatureModifier root;
  DoubleAttackModifier rt1;
  Creature local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  CreatureModifier local_60;
  CreatureModifier local_48;
  CreatureModifier local_30;
  
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Goblin","");
  paVar1 = &local_a8.name.field_2;
  if (local_80 == &local_70) {
    local_a8.name.field_2._8_8_ = local_70._8_8_;
    local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.name._M_dataplus._M_p = (pointer)local_80;
  }
  local_a8.name.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
  local_a8.name.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_a8.name._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_a8.attack = 10;
  local_a8.defense = 0xd;
  local_80 = &local_70;
  poVar2 = operator<<((ostream *)&std::cout,&local_a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_48._vptr_CreatureModifier = (_func_int **)&PTR__CreatureModifier_00103d10;
  local_48.next = (CreatureModifier *)0x0;
  local_30.next = (CreatureModifier *)0x0;
  local_30._vptr_CreatureModifier = (_func_int **)&PTR__CreatureModifier_00103d48;
  local_60.next = (CreatureModifier *)0x0;
  local_60._vptr_CreatureModifier = (_func_int **)&PTR__CreatureModifier_00103d88;
  local_60.creature._M_data = &local_a8;
  local_48.creature._M_data = &local_a8;
  local_30.creature._M_data = &local_a8;
  CreatureModifier::add(&local_48,&local_30);
  CreatureModifier::add(&local_48,&local_60);
  if (local_48.next != (CreatureModifier *)0x0) {
    (*(local_48.next)->_vptr_CreatureModifier[2])();
  }
  poVar2 = operator<<((ostream *)&std::cout,&local_a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p,local_a8.name.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{
	Creature goblin{"Goblin", 10, 13};
	std::cout << goblin << std::endl;

	CreatureModifier root{goblin};
	DoubleAttackModifier rt1{goblin};
	IncreaseDefenseModifier rt2{goblin};
	root.add(&rt1);
	root.add(&rt2);
	root.handle();

	std::cout << goblin << std::endl;
	return 0;
}